

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void lest::report(ostream *os,message *e,text *test)

{
  ostream *poVar1;
  char *__s;
  allocator<char> local_e9;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  comment local_68;
  location local_48;
  
  location::location(&local_48,&e->where);
  poVar1 = operator<<(os,&local_48);
  poVar1 = std::operator<<(poVar1,": ");
  std::__cxx11::string::string((string *)&local_c8,(string *)&e->kind);
  local_88 = local_78;
  if (local_c8 == local_b8) {
    uStack_70 = uStack_b0;
  }
  else {
    local_88 = local_c8;
  }
  local_80 = local_c0;
  local_c0 = 0;
  local_b8[0] = 0;
  local_c8 = local_b8;
  poVar1 = std::operator<<(poVar1,(string *)&local_88);
  std::__cxx11::string::string((string *)&local_68,(string *)&e->note);
  poVar1 = operator<<(poVar1,&local_68);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)test);
  poVar1 = std::operator<<(poVar1,": ");
  __s = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,__s,&local_e9);
  local_a8 = local_98;
  if (local_e8 == local_d8) {
    uStack_90 = uStack_d0;
  }
  else {
    local_a8 = local_e8;
  }
  local_a0 = local_e0;
  local_e0 = 0;
  local_d8[0] = 0;
  local_e8 = local_d8;
  poVar1 = std::operator<<(poVar1,(string *)&local_a8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}